

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O0

void __thiscall
http_request_parsing_smoke02_Test::http_request_parsing_smoke02_Test
          (http_request_parsing_smoke02_Test *this)

{
  http_request_parsing_smoke02_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__http_request_parsing_smoke02_Test_001a7aa8;
  return;
}

Assistant:

GTEST_TEST(http_request_parsing, smoke02)
{
    sub_string str = sub_string::literal(
        "GET / HTTP/1.1" "\r\n"
        "Host: www.amazon.com" "\r\n"
        "Connection: keep-alive" "\r\n"
        "Accept: text/html,application/xhtml+xml,application/xml;q=0.9,image/webp,*/*;q=0.8" "\r\n"
        "Upgrade-Insecure-Requests: 1" "\r\n"
        "User-Agent: Mozilla/5.0 (Windows NT 6.3; WOW64) AppleWebKit/537.36 (KHTML, like Gecko) Chrome/47.0.2526.106 Safari/537.36" "\r\n"
        "Accept-Encoding: gzip, deflate, sdch" "\r\n"
        "Accept-Language: en-US,en;q=0.8,ru;q=0.6" "\r\n"
        "Cookie: x-wl-uid=1zRaamWWvwjLwaG9foMMTNlRn5zDbq2Z3n5dqLYljyFV0g6M0AU0f5NXtJJhlL5xhv19oeBFZVyU=; session-\"token=tK09WOPkx9PdUBvaPen7ew0CCDBGvSQ2xwNgELeJQAJMKxClfFAuffra\"+Ysh8nwdiNcs3NFFq59SviRbRMcSQLr2J9XR7wyEtE6in6joFq3AXUUQq0liD7Pflnhw1uERVtJn2hVXtCTgel2h/4F0Wi1XN/CRwKPg/7Q4OU0xoTthQMkkRBTmhxM1jUF6c9/6x2XVX7CXar4Bqp9W5oOHpj5oMH9eTYfcud8uT655xKeDwmLrWw4C9UiS6MpCwtqd; ubid-main=190-5441568-7691748; session-id-time=2082787201l; session-id=178-4697370-5690842" "\r\n"
        "\r\n");
    http_request request = parse_request(str);
    EXPECT_TRUE(str.empty());
    EXPECT_EQ(request.headers["Host"][0], "www.amazon.com");
}